

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Character * __thiscall World::GetCharacterReal(World *this,string *real_name)

{
  World *pWVar1;
  bool bVar2;
  __type _Var3;
  reference ppCVar4;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  string *local_20;
  string *real_name_local;
  World *this_local;
  
  local_20 = real_name;
  real_name_local = (string *)this;
  util::lowercase((string *)&__range1,real_name);
  std::__cxx11::string::operator=((string *)real_name,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&character);
    if (!bVar2) {
      return (Character *)(World *)0x0;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    pWVar1 = (World *)*ppCVar4;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(pWVar1->timer).timers._M_t._M_impl.super__Rb_tree_header,real_name);
    if (_Var3) break;
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  return (Character *)pWVar1;
}

Assistant:

Character *World::GetCharacterReal(std::string real_name)
{
	real_name = util::lowercase(real_name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->real_name == real_name)
		{
			return character;
		}
	}

	return 0;
}